

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this,
          Descriptor *descriptor,Context *context)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  FieldDescriptor *field;
  ImmutableFieldGenerator *p;
  scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *psVar6;
  ulong uVar7;
  scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_78;
  ImmutableFieldGenerator *generator;
  int i;
  int builderBitIndex;
  int messageBitIndex;
  Context *context_local;
  Descriptor *descriptor_local;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_local;
  
  this->descriptor_ = descriptor;
  iVar2 = Descriptor::field_count(descriptor);
  uVar3 = (ulong)iVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar1 * ZEXT816(8),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar3;
  psVar6 = (scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_78 = psVar6;
    do {
      internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>::scoped_ptr
                (local_78,(ImmutableFieldGenerator *)0x0);
      local_78 = local_78 + 1;
    } while (local_78 != psVar6 + uVar3);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  ::scoped_array(&this->field_generators_,psVar6);
  i = 0;
  generator._4_4_ = 0;
  generator._0_4_ = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(descriptor);
    if (iVar2 <= (int)generator) break;
    field = Descriptor::field(descriptor,(int)generator);
    p = anon_unknown_6::MakeImmutableGenerator(field,i,generator._4_4_,context);
    psVar6 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
             ::operator[](&this->field_generators_,(long)(int)generator);
    internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>::reset(psVar6,p)
    ;
    iVar2 = (*p->_vptr_ImmutableFieldGenerator[2])();
    i = i + iVar2;
    iVar2 = (*p->_vptr_ImmutableFieldGenerator[3])();
    generator._4_4_ = iVar2 + generator._4_4_;
    generator._0_4_ = (int)generator + 1;
  }
  return;
}

Assistant:

FieldGeneratorMap<ImmutableFieldGenerator>::FieldGeneratorMap(
    const Descriptor* descriptor, Context* context)
    : descriptor_(descriptor),
      field_generators_(new google::protobuf::scoped_ptr<
          ImmutableFieldGenerator>[descriptor->field_count()]) {

  // Construct all the FieldGenerators and assign them bit indices for their
  // bit fields.
  int messageBitIndex = 0;
  int builderBitIndex = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    ImmutableFieldGenerator* generator = MakeImmutableGenerator(
        descriptor->field(i), messageBitIndex, builderBitIndex, context);
    field_generators_[i].reset(generator);
    messageBitIndex += generator->GetNumBitsForMessage();
    builderBitIndex += generator->GetNumBitsForBuilder();
  }
}